

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_test.cc
# Opt level: O3

void __thiscall BufTest_Basic_Test::TestBody(BufTest_Basic_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t i;
  long lVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  char *pcVar5;
  pointer pcVar6;
  char *in_R9;
  size_t new_len;
  UniquePtr<BUF_MEM> buf;
  size_t old_max;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_48;
  _Head_base<0UL,_buf_mem_st_*,_false> local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  local_40._M_head_impl = (buf_mem_st *)BUF_MEM_new();
  _Var4._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl._0_1_ = local_40._M_head_impl != (buf_mem_st *)0x0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40._M_head_impl == (buf_mem_st *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_78,(AssertionResult *)0x55fc2f,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
               ,0x1a,(char *)CONCAT71(local_68._1_7_,local_68[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_38);
LAB_00208a06:
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    _Var4._M_head_impl = local_38._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_68._1_7_,local_68[0]),local_58._M_allocated_capacity + 1);
      _Var4._M_head_impl = local_38._M_head_impl;
    }
LAB_0020907f:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_70;
    if ((AssertHelperData *)_Var4._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)_Var4._M_head_impl + 8))();
    }
    local_60 = local_70;
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0020909c;
  }
  else {
    local_78._M_head_impl = _Var4._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"0u","buf->length",(uint *)&local_78,
               (unsigned_long *)local_40._M_head_impl);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x1b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    iVar1 = BUF_MEM_reserve(local_40._M_head_impl,200);
    _Var4._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl._0_1_ = iVar1 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_78,
                 (AssertionResult *)"BUF_MEM_reserve(buf.get(), 200)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x1e,(char *)CONCAT71(local_68._1_7_,local_68[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_38);
      goto LAB_00208a06;
    }
    local_78._M_head_impl._4_4_ = SUB84(_Var4._M_head_impl,4);
    local_78._M_head_impl._0_4_ = 200;
    testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
              ((internal *)local_68,"buf->max","200u",&(local_40._M_head_impl)->max,
               (uint *)&local_78);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x1f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"0u","buf->length",(uint *)&local_78,
               &(local_40._M_head_impl)->length);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x20,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (local_40._M_head_impl)->max;
    iVar1 = BUF_MEM_reserve(local_40._M_head_impl,100);
    local_78._M_head_impl._0_1_ = iVar1 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_78,
                 (AssertionResult *)"BUF_MEM_reserve(buf.get(), 100)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x24,(char *)CONCAT71(local_68._1_7_,local_68[0]));
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
LAB_00209055:
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80.data_
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_68._1_7_,local_68[0]),local_58._M_allocated_capacity + 1);
        _Var4._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_80.data_;
      }
      goto LAB_0020907f;
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_68,"old_max","buf->max",(unsigned_long *)&local_38,
               &(local_40._M_head_impl)->max);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x25,pcVar5);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"0u","buf->length",(uint *)&local_78,
               &(local_40._M_head_impl)->length);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x26,pcVar5);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_80.data_._0_4_ = 100;
    iVar1 = BUF_MEM_grow((BUF_MEM *)local_40._M_head_impl,100);
    local_78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(extraout_var,iVar1);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"100u","BUF_MEM_grow(buf.get(), 100)",(uint *)&local_80,
               (unsigned_long *)&local_78);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x29,pcVar6);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      goto LAB_0020932f;
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_78._M_head_impl._0_4_ = 100;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_68,"100u","buf->length",(uint *)&local_78,
               &(local_40._M_head_impl)->length);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x2a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_68,"old_max","buf->max",(unsigned_long *)&local_38,
               &(local_40._M_head_impl)->max);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x2b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    memset((local_40._M_head_impl)->data,0x41,(local_40._M_head_impl)->length);
    iVar1 = BUF_MEM_reserve(local_40._M_head_impl,(size_t)(local_38._M_head_impl + 1));
    local_78._M_head_impl._0_1_ = iVar1 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_78,
                 (AssertionResult *)"BUF_MEM_reserve(buf.get(), old_max + 1)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x2f,(char *)CONCAT71(local_68._1_7_,local_68[0]));
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
      goto LAB_00209055;
    }
    local_78._M_head_impl = local_38._M_head_impl + 1;
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              ((internal *)local_68,"buf->max","old_max + 1",&(local_40._M_head_impl)->max,
               (unsigned_long *)&local_78);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x30,pcVar6);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
LAB_0020932f:
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      _Var4._M_head_impl = local_78._M_head_impl;
    }
    else {
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      local_78._M_head_impl._0_4_ = 100;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_68,"100u","buf->length",(uint *)&local_78,
                 &(local_40._M_head_impl)->length);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x31,pcVar5);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      lVar2 = 0;
      do {
        local_78._M_head_impl._0_1_ = 0x41;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)local_68,"\'A\'","buf->data[i]",(char *)&local_78,
                   (local_40._M_head_impl)->data + lVar2);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_78);
          pcVar5 = "";
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x33,pcVar5);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_78._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_78._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 100);
      memset((local_40._M_head_impl)->data,0x42,(local_40._M_head_impl)->max);
      local_80.data_._0_4_ = 0x96;
      iVar1 = BUF_MEM_grow((BUF_MEM *)local_40._M_head_impl,0x96);
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(extraout_var_00,iVar1);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_68,"150u","BUF_MEM_grow(buf.get(), 150)",(uint *)&local_80,
                 (unsigned_long *)&local_78);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x38,pcVar6);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        goto LAB_0020932f;
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      local_78._M_head_impl._0_4_ = 0x96;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_68,"150u","buf->length",(uint *)&local_78,
                 &(local_40._M_head_impl)->length);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x39,pcVar5);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      lVar2 = 0;
      do {
        local_78._M_head_impl._0_1_ = 0x42;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)local_68,"\'B\'","buf->data[i]",(char *)&local_78,
                   (local_40._M_head_impl)->data + lVar2);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_78);
          pcVar5 = "";
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x3b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_78._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_78._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 100);
      lVar2 = 100;
      do {
        local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,char>
                  ((internal *)local_68,"0","buf->data[i]",(int *)&local_78,
                   (local_40._M_head_impl)->data + lVar2);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_78);
          pcVar5 = "";
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x3e,pcVar5);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_78._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_78._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x96);
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((local_40._M_head_impl)->max + 1);
      iVar1 = BUF_MEM_grow((BUF_MEM *)local_40._M_head_impl,(size_t)local_78._M_head_impl);
      local_80.data_ = (AssertHelperData *)CONCAT44(extraout_var_01,iVar1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_68,"new_len","BUF_MEM_grow(buf.get(), new_len)",
                 (unsigned_long *)&local_78,(unsigned_long *)&local_80);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x43,pcVar6);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
      }
      else {
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                  ((internal *)local_68,"buf->max","new_len",&(local_40._M_head_impl)->max,
                   (unsigned_long *)&local_78);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x44,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_80.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_68,"new_len","buf->length",(unsigned_long *)&local_78,
                   &(local_40._M_head_impl)->length);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x45,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_80.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        lVar2 = 0;
        do {
          local_80.data_._0_1_ = 0x42;
          testing::internal::CmpHelperEQ<char,char>
                    ((internal *)local_68,"\'B\'","buf->data[i]",(char *)&local_80,
                     (local_40._M_head_impl)->data + lVar2);
          if (local_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_80);
            pcVar5 = "";
            if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar5 = (local_60->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                       ,0x47,pcVar5);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_80.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_80.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 100);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64 <
            local_78._M_head_impl) {
          pbVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64;
          do {
            local_80.data_ = local_80.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<int,char>
                      ((internal *)local_68,"0","buf->data[i]",(int *)&local_80,
                       (local_40._M_head_impl)->data + (long)pbVar3);
            if (local_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_80);
              pcVar5 = "";
              if (local_60 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = (local_60->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                         ,0x4a,pcVar5);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if (local_80.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_80.data_ + 8))();
              }
            }
            if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_60,local_60);
            }
            pbVar3 = pbVar3 + 1;
          } while (pbVar3 < local_78._M_head_impl);
        }
        local_48.data_._0_4_ = 0x32;
        iVar1 = BUF_MEM_grow((BUF_MEM *)local_40._M_head_impl,0x32);
        local_80.data_ = (AssertHelperData *)CONCAT44(extraout_var_02,iVar1);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_68,"50u","BUF_MEM_grow(buf.get(), 50)",(uint *)&local_48,
                   (unsigned_long *)&local_80);
        if (local_68[0] != (internal)0x0) {
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          local_80.data_._0_4_ = 0x32;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_68,"50u","buf->length",(uint *)&local_80,
                     &(local_40._M_head_impl)->length);
          if (local_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_80);
            if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_60->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                       ,0x4f,pcVar5);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_80.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_80.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          lVar2 = 0;
          do {
            local_80.data_._0_1_ = 0x42;
            testing::internal::CmpHelperEQ<char,char>
                      ((internal *)local_68,"\'B\'","buf->data[i]",(char *)&local_80,
                       (local_40._M_head_impl)->data + lVar2);
            if (local_68[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_80);
              pcVar5 = "";
              if (local_60 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = (local_60->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                         ,0x51,pcVar5);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if (local_80.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_80.data_ + 8))();
              }
            }
            if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_60,local_60);
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0x32);
          goto LAB_0020909c;
        }
        testing::Message::Message((Message *)&local_80);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x4e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
      }
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80.data_
      ;
    }
    if ((AssertHelperData *)_Var4._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)_Var4._M_head_impl + 8))();
    }
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0020909c;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_60);
LAB_0020909c:
  std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(BufTest, Basic) {
  bssl::UniquePtr<BUF_MEM> buf(BUF_MEM_new());
  ASSERT_TRUE(buf);
  EXPECT_EQ(0u, buf->length);

  // Use BUF_MEM_reserve to increase buf->max.
  ASSERT_TRUE(BUF_MEM_reserve(buf.get(), 200));
  EXPECT_GE(buf->max, 200u);
  EXPECT_EQ(0u, buf->length);

  // BUF_MEM_reserve with a smaller cap is a no-op.
  size_t old_max = buf->max;
  ASSERT_TRUE(BUF_MEM_reserve(buf.get(), 100));
  EXPECT_EQ(old_max, buf->max);
  EXPECT_EQ(0u, buf->length);

  // BUF_MEM_grow can increase the length without reallocating.
  ASSERT_EQ(100u, BUF_MEM_grow(buf.get(), 100));
  EXPECT_EQ(100u, buf->length);
  EXPECT_EQ(old_max, buf->max);
  memset(buf->data, 'A', buf->length);

  // If BUF_MEM_reserve reallocates, it preserves the contents.
  ASSERT_TRUE(BUF_MEM_reserve(buf.get(), old_max + 1));
  ASSERT_GE(buf->max, old_max + 1);
  EXPECT_EQ(100u, buf->length);
  for (size_t i = 0; i < 100; i++) {
    EXPECT_EQ('A', buf->data[i]);
  }

  // BUF_MEM_grow should zero everything beyond buf->length.
  memset(buf->data, 'B', buf->max);
  ASSERT_EQ(150u, BUF_MEM_grow(buf.get(), 150));
  EXPECT_EQ(150u, buf->length);
  for (size_t i = 0; i < 100; i++) {
    EXPECT_EQ('B', buf->data[i]);
  }
  for (size_t i = 100; i < 150; i++) {
    EXPECT_EQ(0, buf->data[i]);
  }

  // BUF_MEM_grow can rellocate if necessary.
  size_t new_len = buf->max + 1;
  ASSERT_EQ(new_len, BUF_MEM_grow(buf.get(), new_len));
  EXPECT_GE(buf->max, new_len);
  EXPECT_EQ(new_len, buf->length);
  for (size_t i = 0; i < 100; i++) {
    EXPECT_EQ('B', buf->data[i]);
  }
  for (size_t i = 100; i < new_len; i++) {
    EXPECT_EQ(0, buf->data[i]);
  }

  // BUF_MEM_grow can shink.
  ASSERT_EQ(50u, BUF_MEM_grow(buf.get(), 50));
  EXPECT_EQ(50u, buf->length);
  for (size_t i = 0; i < 50; i++) {
    EXPECT_EQ('B', buf->data[i]);
  }
}